

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand.c
# Opt level: O1

CURLcode Curl_rand_bytes(Curl_easy *data,uchar *rnd,size_t num)

{
  CURLcode CVar1;
  CURLcode CVar2;
  undefined8 in_RAX;
  ulong uVar3;
  CURLcode unaff_EBP;
  CURLcode CVar4;
  ulong uVar5;
  uint r;
  undefined8 uStack_38;
  
  if (num != 0) {
    uStack_38 = in_RAX;
    do {
      uVar5 = 4;
      if (num < 4) {
        uVar5 = num;
      }
      CVar1 = Curl_ssl_random(data,(uchar *)((long)&uStack_38 + 4),4);
      uVar3 = uVar5;
      CVar4 = CVar1;
      if (CVar1 == CURLE_OK) {
        do {
          *rnd = uStack_38._4_1_;
          uStack_38 = CONCAT44(uStack_38._4_4_ >> 8,(undefined4)uStack_38);
          rnd = rnd + 1;
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
        num = num - uVar5;
        CVar4 = unaff_EBP;
      }
      CVar2 = CVar4;
    } while ((CVar1 == CURLE_OK) && (CVar2 = CVar1, unaff_EBP = CVar4, num != 0));
    return CVar2;
  }
  return CURLE_BAD_FUNCTION_ARGUMENT;
}

Assistant:

CURLcode Curl_rand_bytes(struct Curl_easy *data,
#ifdef DEBUGBUILD
                         bool env_override,
#endif
                         unsigned char *rnd, size_t num)
{
  CURLcode result = CURLE_BAD_FUNCTION_ARGUMENT;
#ifndef DEBUGBUILD
  const bool env_override = FALSE;
#endif

  DEBUGASSERT(num);

  while(num) {
    unsigned int r;
    size_t left = num < sizeof(unsigned int) ? num : sizeof(unsigned int);

    result = randit(data, &r, env_override);
    if(result)
      return result;

    while(left) {
      *rnd++ = (unsigned char)(r & 0xFF);
      r >>= 8;
      --num;
      --left;
    }
  }

  return result;
}